

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * fts5ExprTermPrint(Fts5ExprTerm *pTerm)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  char *local_38;
  char *zIn;
  int i;
  char *zQuoted;
  Fts5ExprTerm *p;
  sqlite3_int64 nByte;
  Fts5ExprTerm *pTerm_local;
  
  p = (Fts5ExprTerm *)0x0;
  for (zQuoted = (char *)pTerm; zQuoted != (char *)0x0; zQuoted = *(char **)(zQuoted + 0x18)) {
    sVar1 = strlen(pTerm->zTerm);
    p = (Fts5ExprTerm *)(&p->bPrefix + ((int)sVar1 * 2 + 5));
  }
  pcVar2 = (char *)sqlite3_malloc64((sqlite3_uint64)p);
  if (pcVar2 != (char *)0x0) {
    zIn._4_4_ = 0;
    for (zQuoted = (char *)pTerm; zQuoted != (char *)0x0; zQuoted = *(char **)(zQuoted + 0x18)) {
      local_38 = *(char **)(zQuoted + 8);
      pcVar2[zIn._4_4_] = '\"';
      iVar3 = zIn._4_4_;
      while (zIn._4_4_ = iVar3 + 1, *local_38 != '\0') {
        if (*local_38 == '\"') {
          pcVar2[zIn._4_4_] = '\"';
          zIn._4_4_ = iVar3 + 2;
        }
        pcVar2[zIn._4_4_] = *local_38;
        local_38 = local_38 + 1;
        iVar3 = zIn._4_4_;
      }
      pcVar2[zIn._4_4_] = '\"';
      zIn._4_4_ = iVar3 + 2;
      if (*(long *)(zQuoted + 0x18) != 0) {
        zIn._4_4_ = iVar3 + 3;
        pcVar2[iVar3 + 2] = '|';
      }
    }
    if (pTerm->bPrefix != '\0') {
      iVar3 = zIn._4_4_ + 1;
      pcVar2[zIn._4_4_] = ' ';
      zIn._4_4_ = zIn._4_4_ + 2;
      pcVar2[iVar3] = '*';
    }
    pcVar2[zIn._4_4_] = '\0';
  }
  return pcVar2;
}

Assistant:

static char *fts5ExprTermPrint(Fts5ExprTerm *pTerm){
  sqlite3_int64 nByte = 0;
  Fts5ExprTerm *p;
  char *zQuoted;

  /* Determine the maximum amount of space required. */
  for(p=pTerm; p; p=p->pSynonym){
    nByte += (int)strlen(pTerm->zTerm) * 2 + 3 + 2;
  }
  zQuoted = sqlite3_malloc64(nByte);

  if( zQuoted ){
    int i = 0;
    for(p=pTerm; p; p=p->pSynonym){
      char *zIn = p->zTerm;
      zQuoted[i++] = '"';
      while( *zIn ){
        if( *zIn=='"' ) zQuoted[i++] = '"';
        zQuoted[i++] = *zIn++;
      }
      zQuoted[i++] = '"';
      if( p->pSynonym ) zQuoted[i++] = '|';
    }
    if( pTerm->bPrefix ){
      zQuoted[i++] = ' ';
      zQuoted[i++] = '*';
    }
    zQuoted[i++] = '\0';
  }
  return zQuoted;
}